

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_table_scan.cpp
# Opt level: O1

void duckdb::AddProjectionNames(ColumnIndex *index,string *name,LogicalType *type,string *result)

{
  pointer pcVar1;
  const_reference pvVar2;
  long *plVar3;
  size_type *psVar4;
  pointer index_00;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  pointer local_60;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  *local_58;
  string local_50;
  
  if ((index->child_indexes).super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
      .super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (index->child_indexes).super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
      .super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_58 = StructType::GetChildTypes_abi_cxx11_(type);
    index_00 = (index->child_indexes).
               super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
               super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl
               .super__Vector_impl_data._M_start;
    local_60 = (index->child_indexes).
               super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
               super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl
               .super__Vector_impl_data._M_finish;
    if (index_00 != local_60) {
      do {
        pvVar2 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                 ::operator[](local_58,index_00->index);
        local_80[0] = local_70;
        pcVar1 = (name->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_80,pcVar1,pcVar1 + name->_M_string_length);
        ::std::__cxx11::string::append((char *)local_80);
        plVar3 = (long *)::std::__cxx11::string::_M_append
                                   ((char *)local_80,(ulong)(pvVar2->first)._M_dataplus._M_p);
        psVar4 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_50.field_2._M_allocated_capacity = *psVar4;
          local_50.field_2._8_8_ = plVar3[3];
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        }
        else {
          local_50.field_2._M_allocated_capacity = *psVar4;
          local_50._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_50._M_string_length = plVar3[1];
        *plVar3 = (long)psVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        AddProjectionNames(index_00,&local_50,&pvVar2->second,result);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if (local_80[0] != local_70) {
          operator_delete(local_80[0]);
        }
        index_00 = index_00 + 1;
      } while (index_00 != local_60);
    }
    return;
  }
  if (result->_M_string_length != 0) {
    ::std::__cxx11::string::append((char *)result);
  }
  ::std::__cxx11::string::_M_append((char *)result,(ulong)(name->_M_dataplus)._M_p);
  return;
}

Assistant:

void AddProjectionNames(const ColumnIndex &index, const string &name, const LogicalType &type, string &result) {
	if (!index.HasChildren()) {
		// base case - no children projected out
		if (!result.empty()) {
			result += "\n";
		}
		result += name;
		return;
	}
	auto &child_types = StructType::GetChildTypes(type);
	for (auto &child_index : index.GetChildIndexes()) {
		auto &ele = child_types[child_index.GetPrimaryIndex()];
		AddProjectionNames(child_index, name + "." + ele.first, ele.second, result);
	}
}